

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetRenderStyle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double in;
  DObject *this;
  VMValue *pVVar1;
  bool bVar2;
  _func_int **pp_Var3;
  bool local_47;
  ERenderStyle local_44;
  int mode;
  double alpha;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc4,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc4,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_47 = true;
  if (this != (DObject *)0x0) {
    local_47 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_47 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc4,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc5,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc5,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  in = param[1].field_0.f;
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcc6,
                    "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    local_44 = (pVVar1->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcc6,
                    "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_44 = param[2].field_0.i;
  }
  pp_Var3 = (_func_int **)clamp<double>(in,0.0,1.0);
  this[7]._vptr_DObject = pp_Var3;
  FRenderStyle::operator=((FRenderStyle *)&this[6].GCNext,local_44);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRenderStyle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(alpha);
	PARAM_INT_DEF(mode);

	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}